

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plist.cpp
# Opt level: O1

void __thiscall spatial_region::erase(spatial_region *this,plist *a)

{
  particle *ppVar1;
  particle *a_00;
  
  a_00 = a->head;
  while (a_00 != (particle *)0x0) {
    ppVar1 = a_00->next;
    delete_particle(this,a_00,false);
    a_00 = ppVar1;
  }
  a->head = (particle *)0x0;
  a->start = (particle *)0x0;
  return;
}

Assistant:

void spatial_region::erase(plist& a)
{
    particle* current;
    particle* tmp;
    current = a.head;
    while(current!=0)
    {
        tmp = current->next;
        delete_particle(current);
        current = tmp;
    }
    a.head = 0;
    a.start = 0;
}